

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

int trie_append(trie dest,trie src)

{
  trie t;
  long in_RSI;
  trie_cb_iterate in_RDI;
  trie_node_append_iterator_args_type args;
  undefined4 local_4;
  
  if ((in_RDI == (trie_cb_iterate)0x0) || (in_RSI == 0)) {
    local_4 = 1;
  }
  else {
    t = (trie)vector_create(0x106451);
    trie_iterate(t,in_RDI,(trie_cb_iterate_args)0x10646a);
    vector_destroy((vector)0x106474);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int trie_append(trie dest, trie src)
{
	if (dest != NULL && src != NULL)
	{
		struct trie_node_append_iterator_args_type args;

		args.dest = dest;
		args.prefixes = vector_create(sizeof(trie_key));

		trie_iterate(src, &trie_node_append_cb_iterator, &args);

		vector_destroy(args.prefixes);

		return 0;
	}

	return 1;
}